

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O0

void __thiscall cmFindPackageCommand::FillPrefixesUserRegistry(cmFindPackageCommand *this)

{
  bool bVar1;
  mapped_type *outPaths;
  undefined1 local_30 [8];
  string dir;
  cmFindPackageCommand *this_local;
  
  dir.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  bVar1 = cmsys::SystemTools::GetEnv("HOME",(string *)local_30);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)local_30,"/.cmake/packages/");
    std::__cxx11::string::operator+=((string *)local_30,(string *)&this->Name);
    outPaths = std::
               map<cmFindCommon::PathLabel,_cmSearchPath,_std::less<cmFindCommon::PathLabel>,_std::allocator<std::pair<const_cmFindCommon::PathLabel,_cmSearchPath>_>_>
               ::operator[](&(this->super_cmFindCommon).LabeledPaths,
                            &PathLabel::UserRegistry.super_PathLabel);
    LoadPackageRegistryDir(this,(string *)local_30,outPaths);
  }
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void cmFindPackageCommand::FillPrefixesUserRegistry()
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  this->LoadPackageRegistryWinUser();
#elif defined(__HAIKU__)
  char dir[B_PATH_NAME_LENGTH];
  if (find_directory(B_USER_SETTINGS_DIRECTORY, -1, false, dir, sizeof(dir)) ==
      B_OK) {
    std::string fname = dir;
    fname += "/cmake/packages/";
    fname += Name;
    this->LoadPackageRegistryDir(fname,
                                 this->LabeledPaths[PathLabel::UserRegistry]);
  }
#else
  std::string dir;
  if (cmSystemTools::GetEnv("HOME", dir)) {
    dir += "/.cmake/packages/";
    dir += this->Name;
    this->LoadPackageRegistryDir(dir,
                                 this->LabeledPaths[PathLabel::UserRegistry]);
  }
#endif
}